

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O1

errr grab_base_and_int(int *value,char **base,char *name_and_value)

{
  _Bool _Var1;
  int iVar2;
  char *value_name;
  char *pcVar3;
  errr eVar4;
  
  value_name = string_make(name_and_value);
  _Var1 = find_value_arg(value_name,(char *)0x0,0,value);
  eVar4 = 0x1e;
  if (_Var1) {
    iVar2 = strncmp(value_name,"SLAY_",5);
    if (iVar2 == 0) {
      pcVar3 = string_make(value_name + 5);
      *base = pcVar3;
      eVar4 = 0;
    }
  }
  string_free(value_name);
  return eVar4;
}

Assistant:

errr grab_base_and_int(int *value, char **base, const char *name_and_value)
{
	/* Get a rewritable string */
	char *value_name = string_make(name_and_value);

	/* Parse the value expression */
	if (!find_value_arg(value_name, NULL, 0, value)) {
		string_free(value_name);
		return PARSE_ERROR_INVALID_VALUE;
	}

	/* Must be a slay */
	if (strncmp(value_name, "SLAY_", 5)) {
		string_free(value_name);
		return PARSE_ERROR_INVALID_VALUE;
	}
	*base = string_make(value_name + 5);
	string_free(value_name);

	/* If we've got this far, assume it's a valid monster base name */
	return PARSE_ERROR_NONE;
}